

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall Catch::Config::name_abi_cxx11_(string *__return_storage_ptr__,Config *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)(&(this->m_data).name + ((this->m_data).name._M_string_length == 0)));
  return __return_storage_ptr__;
}

Assistant:

virtual std::string name() const { return m_data.name.empty() ? m_data.processName : m_data.name; }